

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawPoly(Vector2 center,int sides,float radius,float rotation,Color color)

{
  float fVar1;
  float fVar2;
  undefined4 local_28;
  undefined4 local_24;
  int i;
  float centralAngle;
  float rotation_local;
  float radius_local;
  int sides_local;
  Color color_local;
  Vector2 center_local;
  
  rotation_local = (float)sides;
  if (sides < 3) {
    rotation_local = 4.2039e-45;
  }
  local_24 = 0.0;
  rlCheckRenderBatchLimit((int)(0x168 / (long)(int)rotation_local) << 2);
  rlPushMatrix();
  sides_local = (int)center.x;
  color_local = (Color)center.y;
  rlTranslatef((float)sides_local,(float)color_local,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  for (local_28 = 0; local_28 < (int)rotation_local; local_28 = local_28 + 1) {
    radius_local._0_1_ = color.r;
    radius_local._1_1_ = color.g;
    radius_local._2_1_ = color.b;
    radius_local._3_1_ = color.a;
    rlColor4ub(radius_local._0_1_,radius_local._1_1_,radius_local._2_1_,radius_local._3_1_);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(0.0,0.0);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar1 = sinf(local_24 * 0.017453292);
    fVar2 = cosf(local_24 * 0.017453292);
    rlVertex2f(fVar1 * radius,fVar2 * radius);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar1 = sinf(local_24 * 0.017453292);
    fVar2 = cosf(local_24 * 0.017453292);
    rlVertex2f(fVar1 * radius,fVar2 * radius);
    local_24 = 360.0 / (float)(int)rotation_local + local_24;
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    fVar1 = sinf(local_24 * 0.017453292);
    fVar2 = cosf(local_24 * 0.017453292);
    rlVertex2f(fVar1 * radius,fVar2 * radius);
  }
  rlEnd();
  rlSetTexture(0);
  rlPopMatrix();
  return;
}

Assistant:

void DrawPoly(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    rlCheckRenderBatchLimit(4*(360/sides));

    rlPushMatrix();
        rlTranslatef(center.x, center.y, 0.0f);
        rlRotatef(rotation, 0.0f, 0.0f, 1.0f);

#if defined(SUPPORT_QUADS_DRAW_MODE)
        rlSetTexture(texShapes.id);

        rlBegin(RL_QUADS);
            for (int i = 0; i < sides; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);

                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(0, 0);

                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);

                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);

                centralAngle += 360.0f/(float)sides;
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
            }
        rlEnd();
        rlSetTexture(0);
#else
        rlBegin(RL_TRIANGLES);
            for (int i = 0; i < sides; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);

                rlVertex2f(0, 0);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);

                centralAngle += 360.0f/(float)sides;
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
            }
        rlEnd();
#endif
    rlPopMatrix();
}